

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

bool __thiscall
bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::MaybeGrow
          (Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *this)

{
  size_t sVar1;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__result;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__first;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__last;
  size_t new_size;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *new_data;
  size_t new_capacity;
  Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *this_local;
  
  if (this->size_ < this->capacity_) {
    this_local._7_1_ = true;
  }
  else {
    new_data = (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)0x10;
    if (this->capacity_ != 0) {
      if (0x7fffffffffffffff < this->capacity_) {
        ERR_put_error(0xe,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                      ,0x14d);
        return false;
      }
      new_data = (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)
                 (this->capacity_ << 1);
    }
    if (new_data < (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)0x2000000000000000)
    {
      __result = (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)
                 OPENSSL_malloc((long)new_data << 3);
      if (__result == (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        sVar1 = this->size_;
        __first = begin(this);
        __last = end(this);
        std::
        uninitialized_move<std::unique_ptr<bssl::ECHServerConfig,bssl::internal::Deleter>*,std::unique_ptr<bssl::ECHServerConfig,bssl::internal::Deleter>*>
                  (__first,__last,__result);
        clear(this);
        this->data_ = __result;
        this->size_ = sVar1;
        this->capacity_ = (size_t)new_data;
        this_local._7_1_ = true;
      }
    }
    else {
      ERR_put_error(0xe,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                    ,0x153);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }